

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_nls_stg.c
# Opt level: O3

int CVodeSetNonlinearSolverSensStg(void *cvode_mem,SUNNonlinearSolver NLS)

{
  SUNNonlinearSolver_Ops p_Var1;
  int iVar2;
  long lVar3;
  int iVar4;
  int error_code;
  code *pcVar5;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "cvode_mem = NULL illegal.";
    iVar4 = -0x15;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x15;
    iVar2 = 0x31;
  }
  else if (NLS == (SUNNonlinearSolver)0x0) {
    msgfmt = "NLS must be non-NULL";
    iVar4 = -0x16;
    cvode_mem = (CVodeMem)0x0;
    error_code = -0x16;
    iVar2 = 0x39;
  }
  else {
    p_Var1 = NLS->ops;
    if (((p_Var1->gettype == (_func_SUNNonlinearSolver_Type_SUNNonlinearSolver *)0x0) ||
        (p_Var1->solve ==
         (_func_int_SUNNonlinearSolver_N_Vector_N_Vector_N_Vector_sunrealtype_int_void_ptr *)0x0))
       || (p_Var1->setsysfn == (_func_SUNErrCode_SUNNonlinearSolver_SUNNonlinSolSysFn *)0x0)) {
      msgfmt = "NLS does not support required operations";
      iVar4 = -0x16;
      error_code = -0x16;
      iVar2 = 0x42;
    }
    else if (*(int *)((long)cvode_mem + 0x8c) == 0) {
      msgfmt = "Forward sensitivity analysis not activated.";
      iVar4 = -0x16;
      error_code = -0x16;
      iVar2 = 0x4a;
    }
    else if (*(int *)((long)cvode_mem + 0x94) == 2) {
      if ((*(long *)((long)cvode_mem + 0x748) != 0) && (*(int *)((long)cvode_mem + 0x750) != 0)) {
        SUNNonlinSolFree();
      }
      *(SUNNonlinearSolver *)((long)cvode_mem + 0x748) = NLS;
      *(undefined4 *)((long)cvode_mem + 0x750) = 0;
      iVar2 = SUNNonlinSolGetType(NLS);
      if (iVar2 == 0) {
        pcVar5 = cvNlsResidualSensStg;
      }
      else {
        iVar2 = SUNNonlinSolGetType(NLS);
        if (iVar2 != 1) {
          msgfmt = "Invalid nonlinear solver type";
          iVar4 = -0x16;
          error_code = -0x16;
          iVar2 = 0x6f;
          goto LAB_0012c64d;
        }
        pcVar5 = cvNlsFPFunctionSensStg;
      }
      iVar2 = SUNNonlinSolSetSysFn(*(undefined8 *)((long)cvode_mem + 0x748),pcVar5);
      if (iVar2 == 0) {
        iVar2 = SUNNonlinSolSetConvTestFn
                          (*(undefined8 *)((long)cvode_mem + 0x748),cvNlsConvTestSensStg,cvode_mem);
        if (iVar2 == 0) {
          iVar2 = SUNNonlinSolSetMaxIters(*(undefined8 *)((long)cvode_mem + 0x748),3);
          if (iVar2 == 0) {
            if (*(int *)((long)cvode_mem + 0x7bc) != 0) {
LAB_0012c7ac:
              iVar2 = *(int *)((long)cvode_mem + 0x90);
              if (0 < (long)iVar2) {
                lVar3 = 0;
                do {
                  *(undefined8 *)(*(long *)**(undefined8 **)((long)cvode_mem + 0x7a0) + lVar3 * 8) =
                       *(undefined8 *)(*(long *)((long)cvode_mem + 0x288) + lVar3 * 8);
                  *(undefined8 *)(*(long *)**(undefined8 **)((long)cvode_mem + 0x7a8) + lVar3 * 8) =
                       *(undefined8 *)(*(long *)((long)cvode_mem + 0x300) + lVar3 * 8);
                  *(undefined8 *)(*(long *)**(undefined8 **)((long)cvode_mem + 0x7b0) + lVar3 * 8) =
                       *(undefined8 *)(*(long *)((long)cvode_mem + 0x2f0) + lVar3 * 8);
                  lVar3 = lVar3 + 1;
                } while (iVar2 != lVar3);
              }
              *(undefined4 *)((long)cvode_mem + 0x578) = 0;
              return 0;
            }
            lVar3 = N_VNewEmpty_SensWrapper(*(undefined4 *)((long)cvode_mem + 0x90),*cvode_mem);
            *(long *)((long)cvode_mem + 0x7a0) = lVar3;
            if (lVar3 == 0) {
              msgfmt = "A memory request failed.";
              iVar4 = -0x14;
              error_code = -0x14;
              iVar2 = 0x94;
            }
            else {
              lVar3 = N_VNewEmpty_SensWrapper(*(undefined4 *)((long)cvode_mem + 0x90),*cvode_mem);
              *(long *)((long)cvode_mem + 0x7a8) = lVar3;
              if (lVar3 == 0) {
                N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x7a0));
                msgfmt = "A memory request failed.";
                iVar4 = -0x14;
                error_code = -0x14;
                iVar2 = 0x9d;
              }
              else {
                lVar3 = N_VNewEmpty_SensWrapper(*(undefined4 *)((long)cvode_mem + 0x90),*cvode_mem);
                *(long *)((long)cvode_mem + 0x7b0) = lVar3;
                if (lVar3 != 0) {
                  *(undefined4 *)((long)cvode_mem + 0x7bc) = 1;
                  goto LAB_0012c7ac;
                }
                N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x7a0));
                N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x7a8));
                msgfmt = "A memory request failed.";
                iVar4 = -0x14;
                error_code = -0x14;
                iVar2 = 0xa7;
              }
            }
          }
          else {
            msgfmt = "Setting maximum number of nonlinear iterations failed";
            iVar4 = -0x16;
            error_code = -0x16;
            iVar2 = 0x89;
          }
        }
        else {
          msgfmt = "Setting convergence test function failed";
          iVar4 = -0x16;
          error_code = -0x16;
          iVar2 = 0x80;
        }
      }
      else {
        msgfmt = "Setting nonlinear system function failed";
        iVar4 = -0x16;
        error_code = -0x16;
        iVar2 = 0x76;
      }
    }
    else {
      msgfmt = "Sensitivity solution method is not CV_STAGGERED";
      iVar4 = -0x16;
      error_code = -0x16;
      iVar2 = 0x52;
    }
  }
LAB_0012c64d:
  cvProcessError((CVodeMem)cvode_mem,error_code,iVar2,"CVodeSetNonlinearSolverSensStg",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_nls_stg.c"
                 ,msgfmt);
  return iVar4;
}

Assistant:

int CVodeSetNonlinearSolverSensStg(void* cvode_mem, SUNNonlinearSolver NLS)
{
  CVodeMem cv_mem;
  int retval, is;

  /* Return immediately if CVode memory is NULL */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Return immediately if NLS memory is NULL */
  if (NLS == NULL)
  {
    cvProcessError(NULL, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "NLS must be non-NULL");
    return (CV_ILL_INPUT);
  }

  /* check for required nonlinear solver functions */
  if (NLS->ops->gettype == NULL || NLS->ops->solve == NULL ||
      NLS->ops->setsysfn == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "NLS does not support required operations");
    return (CV_ILL_INPUT);
  }

  /* check that sensitivities were initialized */
  if (!(cv_mem->cv_sensi))
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NO_SENSI);
    return (CV_ILL_INPUT);
  }

  /* check that staggered corrector was selected */
  if (cv_mem->cv_ism != CV_STAGGERED)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Sensitivity solution method is not CV_STAGGERED");
    return (CV_ILL_INPUT);
  }

  /* free any existing nonlinear solver */
  if ((cv_mem->NLSstg != NULL) && (cv_mem->ownNLSstg))
  {
    retval = SUNNonlinSolFree(cv_mem->NLSstg);
  }

  /* set SUNNonlinearSolver pointer */
  cv_mem->NLSstg = NLS;

  /* Set NLS ownership flag. If this function was called to attach the default
     NLS, CVODE will set the flag to SUNTRUE after this function returns. */
  cv_mem->ownNLSstg = SUNFALSE;

  /* set the nonlinear system function */
  if (SUNNonlinSolGetType(NLS) == SUNNONLINEARSOLVER_ROOTFIND)
  {
    retval = SUNNonlinSolSetSysFn(cv_mem->NLSstg, cvNlsResidualSensStg);
  }
  else if (SUNNonlinSolGetType(NLS) == SUNNONLINEARSOLVER_FIXEDPOINT)
  {
    retval = SUNNonlinSolSetSysFn(cv_mem->NLSstg, cvNlsFPFunctionSensStg);
  }
  else
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Invalid nonlinear solver type");
    return (CV_ILL_INPUT);
  }

  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Setting nonlinear system function failed");
    return (CV_ILL_INPUT);
  }

  /* set convergence test function */
  retval = SUNNonlinSolSetConvTestFn(cv_mem->NLSstg, cvNlsConvTestSensStg,
                                     cvode_mem);
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Setting convergence test function failed");
    return (CV_ILL_INPUT);
  }

  /* set max allowed nonlinear iterations */
  retval = SUNNonlinSolSetMaxIters(cv_mem->NLSstg, NLS_MAXCOR);
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Setting maximum number of nonlinear iterations failed");
    return (CV_ILL_INPUT);
  }

  /* create vector wrappers if necessary */
  if (cv_mem->stgMallocDone == SUNFALSE)
  {
    cv_mem->zn0Stg = N_VNewEmpty_SensWrapper(cv_mem->cv_Ns, cv_mem->cv_sunctx);
    if (cv_mem->zn0Stg == NULL)
    {
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     MSGCV_MEM_FAIL);
      return (CV_MEM_FAIL);
    }

    cv_mem->ycorStg = N_VNewEmpty_SensWrapper(cv_mem->cv_Ns, cv_mem->cv_sunctx);
    if (cv_mem->ycorStg == NULL)
    {
      N_VDestroy(cv_mem->zn0Stg);
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     MSGCV_MEM_FAIL);
      return (CV_MEM_FAIL);
    }

    cv_mem->ewtStg = N_VNewEmpty_SensWrapper(cv_mem->cv_Ns, cv_mem->cv_sunctx);
    if (cv_mem->ewtStg == NULL)
    {
      N_VDestroy(cv_mem->zn0Stg);
      N_VDestroy(cv_mem->ycorStg);
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     MSGCV_MEM_FAIL);
      return (CV_MEM_FAIL);
    }

    cv_mem->stgMallocDone = SUNTRUE;
  }

  /* attach vectors to vector wrappers */
  for (is = 0; is < cv_mem->cv_Ns; is++)
  {
    NV_VEC_SW(cv_mem->zn0Stg, is)  = cv_mem->cv_znS[0][is];
    NV_VEC_SW(cv_mem->ycorStg, is) = cv_mem->cv_acorS[is];
    NV_VEC_SW(cv_mem->ewtStg, is)  = cv_mem->cv_ewtS[is];
  }

  /* Reset the acnrmScur flag to SUNFALSE */
  cv_mem->cv_acnrmScur = SUNFALSE;

  return (CV_SUCCESS);
}